

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

string * __thiscall
boost::deflate::inflate_stream_test::corpus1_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,size_t n)

{
  int iVar1;
  result_type rVar2;
  result_type rVar3;
  uniform_int_distribution<unsigned_long> d1;
  uniform_int_distribution<unsigned_long> d0;
  mt19937 g;
  uniform_int_distribution<unsigned_long> local_13d8;
  uniform_int_distribution<unsigned_long> local_13c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  if (corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_,
                 "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",
                 (allocator<char> *)&local_13b8);
      __cxa_atexit(std::__cxx11::string::~string,
                   &corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13b8);
  local_13c8._M_param._M_b =
       corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_._M_string_length - 1;
  local_13c8._M_param._M_a = 0;
  local_13d8._M_param._M_a = 1;
  local_13d8._M_param._M_b = 5;
  while ((inflate_stream_test *)__return_storage_ptr__->_M_string_length < this) {
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()(&local_13d8,&local_13b8);
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&local_13c8,&local_13b8);
    std::__cxx11::string::insert
              (__return_storage_ptr__,
               (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length
               ,rVar2,(int)corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_._M_dataplus._M_p
                           [rVar3]);
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string corpus1(std::size_t n)
    {
        static std::string const alphabet{
            "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
        };
        std::string s;
        s.reserve(n + 5);
        std::mt19937 g;
        std::uniform_int_distribution<std::size_t> d0{
            0, alphabet.size() - 1};
        std::uniform_int_distribution<std::size_t> d1{
            1, 5};
        while(s.size() < n)
        {
            auto const rep = d1(g);
            auto const ch = alphabet[d0(g)];
            s.insert(s.end(), rep, ch);
        }
        s.resize(n);
        return s;
    }